

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Poly::Get_y_dx(ChFunction_Poly *this,double x)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int i;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [64];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  
  dVar7 = 0.0;
  lVar5 = 1;
  iVar3 = 0;
  while (lVar5 <= this->order) {
    iVar4 = (int)lVar5;
    dVar1 = this->coeff[lVar5];
    auVar6._0_8_ = pow(x,(double)iVar3);
    auVar6._8_56_ = extraout_var;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar7;
    lVar5 = lVar5 + 1;
    iVar3 = iVar3 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (double)iVar4 * dVar1;
    auVar2 = vfmadd231sd_fma(auVar8,auVar6._0_16_,auVar2);
    dVar7 = auVar2._0_8_;
  }
  return dVar7;
}

Assistant:

double ChFunction_Poly::Get_y_dx(double x) const {
    double total = 0;
    for (int i = 1; i <= order; i++) {
        total += ((double)i * coeff[i] * pow(x, ((double)(i - 1))));
    }
    return total;
}